

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_action_inout(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  uint32_t uVar1;
  lys_module *plVar2;
  LY_ERR LVar3;
  uint uVar4;
  long local_e0;
  lysp_ext_instance *local_c0;
  lysp_ext_instance *local_b0;
  lysp_ext_instance *local_98;
  lysp_ext_instance *local_88;
  long local_68;
  long local_60;
  long *local_58;
  char *p__;
  uint64_t __u;
  lysc_node_action_inout *inout;
  lysp_node_action_inout *inout_p;
  lysp_node *plStack_30;
  uint32_t prev_options;
  lysp_node *child_p;
  LY_ERR ret;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  uVar1 = ctx->compile_opts;
  if (pnode[1].parent == (lysp_node *)0x0) {
LAB_00171445:
    uVar4 = 0x2004;
    if (pnode->nodetype == 0x1000) {
      uVar4 = 0x1004;
    }
    ctx->compile_opts = uVar4 | ctx->compile_opts;
    for (plStack_30 = (lysp_node *)pnode[1].name; plStack_30 != (lysp_node *)0x0;
        plStack_30 = plStack_30->next) {
      LVar3 = lys_compile_node(ctx,plStack_30,node,0,(ly_set *)0x0);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    child_p._4_4_ = lys_compile_node_augments(ctx,node);
    if (child_p._4_4_ == LY_SUCCESS) {
      ctx->compile_opts = uVar1;
    }
  }
  else {
    if (node[1].module == (lys_module *)0x0) {
      local_68 = 0;
    }
    else {
      if (node[1].module == (lys_module *)0x0) {
        local_60 = 0;
      }
      else {
        plVar2 = node[1].module;
        local_60._0_1_ = plVar2[-1].implemented;
        local_60._1_1_ = plVar2[-1].to_compile;
        local_60._2_1_ = plVar2[-1].latest_revision;
        local_60._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
      }
      local_68 = local_60;
    }
    if (node[1].module == (lys_module *)0x0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_98 = (lysp_ext_instance *)0x0;
      }
      else {
        local_98 = pnode[1].parent[-1].exts;
      }
      local_58 = (long *)calloc(1,((long)&local_98->name + local_68) * 0x38 + 8);
      if (local_58 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_node_action_inout");
        return LY_EMEM;
      }
    }
    else {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_88 = (lysp_ext_instance *)0x0;
      }
      else {
        local_88 = pnode[1].parent[-1].exts;
      }
      local_58 = (long *)realloc(&node[1].module[-1].implemented,
                                 ((long)&local_88->name +
                                 *(long *)&node[1].module[-1].implemented + local_68) * 0x38 + 8);
      if (local_58 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_node_action_inout");
        return LY_EMEM;
      }
    }
    node[1].module = (lys_module *)(local_58 + 1);
    if (node[1].module != (lys_module *)0x0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_b0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_b0 = pnode[1].parent[-1].exts;
      }
      memset(&(node[1].module)->ctx + *local_58 * 7,0,((long)&local_b0->name + local_68) * 0x38);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_c0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_c0 = pnode[1].parent[-1].exts;
      }
      if (local_c0 <= p__) goto LAB_00171445;
      *(long *)&node[1].module[-1].implemented = *(long *)&node[1].module[-1].implemented + 1;
      if (node[1].module == (lys_module *)0x0) {
        local_e0 = 0;
      }
      else {
        plVar2 = node[1].module;
        local_e0._0_1_ = plVar2[-1].implemented;
        local_e0._1_1_ = plVar2[-1].to_compile;
        local_e0._2_1_ = plVar2[-1].latest_revision;
        local_e0._3_5_ = *(undefined5 *)&plVar2[-1].field_0x7b;
      }
      child_p._4_4_ =
           lys_compile_must(ctx,(lysp_restr *)(pnode[1].parent + (long)p__),
                            (lysc_must *)((long)node[1].module + (local_e0 + -1) * 0x38));
      if (child_p._4_4_ != LY_SUCCESS) break;
      p__ = p__ + 1;
    }
  }
  return child_p._4_4_;
}

Assistant:

LY_ERR
lys_compile_node_action_inout(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p;
    uint32_t prev_options = ctx->compile_opts;

    struct lysp_node_action_inout *inout_p = (struct lysp_node_action_inout *)pnode;
    struct lysc_node_action_inout *inout = (struct lysc_node_action_inout *)node;

    COMPILE_ARRAY_GOTO(ctx, inout_p->musts, inout->musts, lys_compile_must, ret, done);
    ctx->compile_opts |= (inout_p->nodetype == LYS_INPUT) ? LYS_COMPILE_RPC_INPUT : LYS_COMPILE_RPC_OUTPUT;

    LY_LIST_FOR(inout_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node(ctx, child_p, node, 0, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    ctx->compile_opts = prev_options;

done:
    return ret;
}